

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrDEC0xd6(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  uint8_t uVar1;
  byte bVar2;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar1 = Memory::Read8(this->m,addr);
  bVar2 = uVar1 + this->X;
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,(ushort)bVar2);
  value = uVar1 - 1;
  this->field_0x2e = value >> 7 | (value == 0) << 6 | this->field_0x2e & 0xbe;
  Memory::Write8(this_00,(ushort)bVar2,value);
  return 6;
}

Assistant:

int CPU::instrDEC0xd6() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}